

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

streamsize __thiscall
tcu::DebugOutStreambuf::xsputn(DebugOutStreambuf *this,char *s,streamsize count)

{
  long lVar1;
  
  if (0 < count) {
    lVar1 = 0;
    do {
      std::ostream::put((char)this + '@');
      if (s[lVar1] == '\n') {
        flushLine(this);
      }
      lVar1 = lVar1 + 1;
    } while (count != lVar1);
  }
  return count;
}

Assistant:

std::streamsize DebugOutStreambuf::xsputn (const char* s, std::streamsize count)
{
	for (std::streamsize pos = 0; pos < count; pos++)
	{
		m_curLine.put(s[pos]);

		if (s[pos] == '\n')
			flushLine();
	}

	return count;
}